

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn2.cpp
# Opt level: O0

void __thiscall YmFmOPN2::YmFmOPN2(YmFmOPN2 *this,OPNFamily f)

{
  ymfm_interface *this_00;
  ym2612 *this_01;
  ymfm_interface_conflict *intf;
  OPNFamily f_local;
  YmFmOPN2 *this_local;
  
  OPNChipBaseT<YmFmOPN2>::OPNChipBaseT(&this->super_OPNChipBaseT<YmFmOPN2>,f);
  (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase._vptr_OPNChipBase =
       (_func_int **)&PTR__YmFmOPN2_002fc2f0;
  this->m_headPos = 0;
  this->m_tailPos = 0;
  this->m_queueCount = 0;
  this_00 = (ymfm_interface *)operator_new(0x10);
  ymfm::ymfm_interface::ymfm_interface(this_00);
  this->m_intf = this_00;
  this_01 = (ym2612 *)operator_new(0xb28);
  ymfm::ym2612::ym2612(this_01,this_00);
  this->m_chip = this_01;
  setRate(this,(this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_rate,
          (this->super_OPNChipBaseT<YmFmOPN2>).super_OPNChipBase.m_clock);
  return;
}

Assistant:

YmFmOPN2::YmFmOPN2(OPNFamily f) :
    OPNChipBaseT(f),
    m_headPos(0),
    m_tailPos(0),
    m_queueCount(0)
{
    ymfm::ymfm_interface* intf = new ymfm::ymfm_interface;
    m_intf = intf;
    m_chip = new ymfm::ym2612(*intf);
    setRate(m_rate, m_clock);
}